

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O0

parser * init_parse_room(void)

{
  parser *p_00;
  parser *p;
  
  p_00 = parser_new();
  parser_setpriv(p_00,(void *)0x0);
  parser_reg(p_00,"name str name",parse_room_name);
  parser_reg(p_00,"type uint type",parse_room_type);
  parser_reg(p_00,"rating int rating",parse_room_rating);
  parser_reg(p_00,"rows uint height",parse_room_height);
  parser_reg(p_00,"columns uint width",parse_room_width);
  parser_reg(p_00,"doors uint doors",parse_room_doors);
  parser_reg(p_00,"tval sym tval",parse_room_tval);
  parser_reg(p_00,"flags str flags",parse_room_flags);
  parser_reg(p_00,"D str text",parse_room_d);
  return p_00;
}

Assistant:

static struct parser *init_parse_room(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "name str name", parse_room_name);
	parser_reg(p, "type uint type", parse_room_type);
	parser_reg(p, "rating int rating", parse_room_rating);
	parser_reg(p, "rows uint height", parse_room_height);
	parser_reg(p, "columns uint width", parse_room_width);
	parser_reg(p, "doors uint doors", parse_room_doors);
	parser_reg(p, "tval sym tval", parse_room_tval);
	parser_reg(p, "flags str flags", parse_room_flags);
	parser_reg(p, "D str text", parse_room_d);
	return p;
}